

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersector1<8,_16777232,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceArrayIntersector1MB>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  AABBNodeMB4D *node1;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive *prim;
  ulong uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined4 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [64];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  Precalculations pre;
  NodeRef stack [564];
  Precalculations local_1301;
  Ray *local_1300;
  ulong local_12f8;
  ulong *local_12f0;
  RayQueryContext *local_12e8;
  long local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  uint uVar24;
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_12f0 = local_11d0;
      aVar2 = (ray->dir).field_0;
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar19._8_4_ = 0x7fffffff;
      auVar19._0_8_ = 0x7fffffff7fffffff;
      auVar19._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx((undefined1  [16])aVar2,auVar19);
      auVar26._8_4_ = 0x219392ef;
      auVar26._0_8_ = 0x219392ef219392ef;
      auVar26._12_4_ = 0x219392ef;
      auVar19 = vcmpps_avx(auVar19,auVar26,1);
      auVar19 = vblendvps_avx((undefined1  [16])aVar2,auVar26,auVar19);
      auVar26 = vrcpps_avx(auVar19);
      auVar27._8_4_ = 0x3f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar27._12_4_ = 0x3f800000;
      auVar19 = vfnmadd231ps_fma(auVar27,auVar26,auVar19);
      auVar8 = vfmadd132ps_fma(auVar19,auVar26,auVar26);
      fVar25 = auVar8._0_4_;
      local_11f8._4_4_ = fVar25;
      local_11f8._0_4_ = fVar25;
      local_11f8._8_4_ = fVar25;
      local_11f8._12_4_ = fVar25;
      local_11f8._16_4_ = fVar25;
      local_11f8._20_4_ = fVar25;
      local_11f8._24_4_ = fVar25;
      local_11f8._28_4_ = fVar25;
      auVar32 = ZEXT3264(local_11f8);
      auVar19 = vmovshdup_avx(auVar8);
      uVar22 = auVar19._0_8_;
      local_1218._8_8_ = uVar22;
      local_1218._0_8_ = uVar22;
      local_1218._16_8_ = uVar22;
      local_1218._24_8_ = uVar22;
      auVar33 = ZEXT3264(local_1218);
      auVar27 = vshufpd_avx(auVar8,auVar8,1);
      auVar26 = vshufps_avx(auVar8,auVar8,0xaa);
      uVar22 = auVar26._0_8_;
      local_1238._8_8_ = uVar22;
      local_1238._0_8_ = uVar22;
      local_1238._16_8_ = uVar22;
      local_1238._24_8_ = uVar22;
      auVar34 = ZEXT3264(local_1238);
      auVar28._0_4_ = fVar25 * (ray->org).field_0.m128[0];
      auVar28._4_4_ = auVar8._4_4_ * (ray->org).field_0.m128[1];
      auVar28._8_4_ = auVar8._8_4_ * (ray->org).field_0.m128[2];
      auVar28._12_4_ = auVar8._12_4_ * (ray->org).field_0.m128[3];
      auVar26 = vmovshdup_avx(auVar28);
      auVar8 = vshufps_avx(auVar28,auVar28,0xaa);
      local_12f8 = (ulong)(fVar25 < 0.0) << 5;
      uVar14 = (ulong)(auVar19._0_4_ < 0.0) << 5 | 0x40;
      uVar17 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x80;
      uVar15 = local_12f8 ^ 0x20;
      uVar16 = CONCAT44(auVar28._0_4_,auVar28._0_4_);
      local_1258._0_8_ = uVar16 ^ 0x8000000080000000;
      local_1258._8_4_ = -auVar28._0_4_;
      local_1258._12_4_ = -auVar28._0_4_;
      local_1258._16_4_ = -auVar28._0_4_;
      local_1258._20_4_ = -auVar28._0_4_;
      local_1258._24_4_ = -auVar28._0_4_;
      local_1258._28_4_ = -auVar28._0_4_;
      auVar30 = ZEXT3264(local_1258);
      uVar10 = auVar26._0_4_;
      uVar24 = auVar26._4_4_;
      local_1278._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      local_1278._8_4_ = uVar10 ^ 0x80000000;
      local_1278._12_4_ = uVar24 ^ 0x80000000;
      local_1278._16_4_ = uVar10 ^ 0x80000000;
      local_1278._20_4_ = uVar24 ^ 0x80000000;
      local_1278._24_4_ = uVar10 ^ 0x80000000;
      local_1278._28_4_ = uVar24 ^ 0x80000000;
      auVar23 = ZEXT3264(local_1278);
      uVar10 = auVar8._0_4_;
      uVar24 = auVar8._4_4_;
      local_1298._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
      local_1298._8_4_ = uVar10 ^ 0x80000000;
      local_1298._12_4_ = uVar24 ^ 0x80000000;
      local_1298._16_4_ = uVar10 ^ 0x80000000;
      local_1298._20_4_ = uVar24 ^ 0x80000000;
      local_1298._24_4_ = uVar10 ^ 0x80000000;
      local_1298._28_4_ = uVar24 ^ 0x80000000;
      auVar29 = ZEXT3264(local_1298);
      uVar21 = auVar3._0_4_;
      local_12b8._4_4_ = uVar21;
      local_12b8._0_4_ = uVar21;
      local_12b8._8_4_ = uVar21;
      local_12b8._12_4_ = uVar21;
      local_12b8._16_4_ = uVar21;
      local_12b8._20_4_ = uVar21;
      local_12b8._24_4_ = uVar21;
      local_12b8._28_4_ = uVar21;
      auVar31 = ZEXT3264(local_12b8);
      local_12d8._4_4_ = fVar1;
      local_12d8._0_4_ = fVar1;
      local_12d8._8_4_ = fVar1;
      local_12d8._12_4_ = fVar1;
      local_12d8._16_4_ = fVar1;
      local_12d8._20_4_ = fVar1;
      local_12d8._24_4_ = fVar1;
      local_12d8._28_4_ = fVar1;
      auVar35 = ZEXT3264(local_12d8);
      uVar16 = local_12f8;
      local_1300 = ray;
      local_12e8 = context;
LAB_004d628b:
      do {
        uVar12 = local_12f0[-1];
        local_12f0 = local_12f0 + -1;
        while ((uVar12 & 8) == 0) {
          uVar9 = uVar12 & 0xfffffffffffffff0;
          uVar21 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar20._4_4_ = uVar21;
          auVar20._0_4_ = uVar21;
          auVar20._8_4_ = uVar21;
          auVar20._12_4_ = uVar21;
          auVar20._16_4_ = uVar21;
          auVar20._20_4_ = uVar21;
          auVar20._24_4_ = uVar21;
          auVar20._28_4_ = uVar21;
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar16),auVar20,
                                    *(undefined1 (*) [32])(uVar9 + 0x40 + uVar16));
          auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar32._0_32_,auVar30._0_32_);
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar14),auVar20,
                                   *(undefined1 (*) [32])(uVar9 + 0x40 + uVar14));
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar33._0_32_,auVar23._0_32_);
          auVar5 = vpmaxsd_avx2(ZEXT1632(auVar19),ZEXT1632(auVar3));
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar17),auVar20,
                                    *(undefined1 (*) [32])(uVar9 + 0x40 + uVar17));
          auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar34._0_32_,auVar29._0_32_);
          auVar6 = vpmaxsd_avx2(ZEXT1632(auVar19),auVar31._0_32_);
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar15),auVar20,
                                    *(undefined1 (*) [32])(uVar9 + 0x40 + uVar15));
          auVar5 = vpmaxsd_avx2(auVar5,auVar6);
          auVar3 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + (uVar14 ^ 0x20)),auVar20,
                                   *(undefined1 (*) [32])(uVar9 + 0x40 + (uVar14 ^ 0x20)));
          auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar32._0_32_,auVar30._0_32_);
          auVar3 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar33._0_32_,auVar23._0_32_);
          auVar6 = vpminsd_avx2(ZEXT1632(auVar19),ZEXT1632(auVar3));
          auVar19 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + (uVar17 ^ 0x20)),auVar20,
                                    *(undefined1 (*) [32])(uVar9 + 0x40 + (uVar17 ^ 0x20)));
          auVar19 = vfmadd213ps_fma(ZEXT1632(auVar19),auVar34._0_32_,auVar29._0_32_);
          auVar7 = vpminsd_avx2(ZEXT1632(auVar19),auVar35._0_32_);
          auVar6 = vpminsd_avx2(auVar6,auVar7);
          auVar5 = vcmpps_avx(auVar5,auVar6,2);
          if (((uint)uVar12 & 7) == 6) {
            auVar6 = vcmpps_avx(*(undefined1 (*) [32])(uVar9 + 0x1c0),auVar20,2);
            auVar7 = vcmpps_avx(auVar20,*(undefined1 (*) [32])(uVar9 + 0x1e0),1);
            auVar6 = vandps_avx(auVar6,auVar7);
            auVar5 = vandps_avx(auVar6,auVar5);
            auVar19 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
          }
          else {
            auVar19 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
          }
          auVar19 = vpsllw_avx(auVar19,0xf);
          if ((((((((auVar19 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar19 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar19 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar19 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar19 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar19 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar19 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar19[0xf]) {
            if (local_12f0 == &local_11d8) {
              return;
            }
            goto LAB_004d628b;
          }
          auVar19 = vpacksswb_avx(auVar19,auVar19);
          bVar4 = SUB161(auVar19 >> 7,0) & 1 | (SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar19 >> 0x17,0) & 1) << 2 | (SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar19 >> 0x27,0) & 1) << 4 | (SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar19 >> 0x37,0) & 1) << 6 | SUB161(auVar19 >> 0x3f,0) << 7;
          lVar13 = 0;
          for (uVar12 = (ulong)bVar4; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000)
          {
            lVar13 = lVar13 + 1;
          }
          uVar12 = *(ulong *)(uVar9 + lVar13 * 8);
          uVar10 = bVar4 - 1 & (uint)bVar4;
          uVar11 = (ulong)uVar10;
          if (uVar10 != 0) {
            *local_12f0 = uVar12;
            lVar13 = 0;
            for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
              lVar13 = lVar13 + 1;
            }
            uVar10 = uVar10 - 1 & uVar10;
            uVar11 = (ulong)uVar10;
            bVar18 = uVar10 == 0;
            while( true ) {
              local_12f0 = local_12f0 + 1;
              uVar12 = *(ulong *)(uVar9 + lVar13 * 8);
              if (bVar18) break;
              *local_12f0 = uVar12;
              lVar13 = 0;
              for (uVar12 = uVar11; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                lVar13 = lVar13 + 1;
              }
              uVar11 = uVar11 - 1 & uVar11;
              bVar18 = uVar11 == 0;
            }
          }
        }
        local_12e0 = (ulong)((uint)uVar12 & 0xf) - 8;
        if (local_12e0 != 0) {
          prim = (Primitive *)(uVar12 & 0xfffffffffffffff0);
          do {
            bVar18 = InstanceArrayIntersector1MB::occluded(&local_1301,ray,local_12e8,prim);
            if (bVar18) {
              local_1300->tfar = -INFINITY;
              return;
            }
            prim = prim + 1;
            local_12e0 = local_12e0 + -1;
            ray = local_1300;
          } while (local_12e0 != 0);
        }
        auVar32 = ZEXT3264(local_11f8);
        auVar33 = ZEXT3264(local_1218);
        auVar34 = ZEXT3264(local_1238);
        auVar30 = ZEXT3264(local_1258);
        auVar23 = ZEXT3264(local_1278);
        auVar29 = ZEXT3264(local_1298);
        auVar31 = ZEXT3264(local_12b8);
        auVar35 = ZEXT3264(local_12d8);
        uVar16 = local_12f8;
      } while (local_12f0 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }